

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_sse2.c
# Opt level: O0

void SharpYuvUpdateRGB_SSE2(int16_t *ref,int16_t *src,int16_t *dst,int len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int local_90;
  int diff_uv;
  __m128i E;
  __m128i D;
  __m128i C;
  __m128i B;
  __m128i A;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  int i;
  int len_local;
  int16_t *dst_local;
  int16_t *src_local;
  
  for (local_90 = 0; local_90 + 8 <= len; local_90 = local_90 + 8) {
    uVar1 = *(undefined8 *)(ref + local_90);
    uVar2 = *(undefined8 *)(ref + local_90 + 4);
    uVar3 = *(undefined8 *)(src + local_90);
    uVar4 = *(undefined8 *)(src + local_90 + 4);
    uVar5 = *(undefined8 *)(dst + local_90);
    uVar6 = *(undefined8 *)(dst + local_90 + 4);
    C[1]._0_2_ = (short)uVar1;
    C[1]._2_2_ = (short)((ulong)uVar1 >> 0x10);
    C[1]._4_2_ = (short)((ulong)uVar1 >> 0x20);
    C[1]._6_2_ = (short)((ulong)uVar1 >> 0x30);
    B[0]._0_2_ = (short)uVar2;
    B[0]._2_2_ = (short)((ulong)uVar2 >> 0x10);
    B[0]._4_2_ = (short)((ulong)uVar2 >> 0x20);
    B[0]._6_2_ = (short)((ulong)uVar2 >> 0x30);
    D[1]._0_2_ = (short)uVar3;
    D[1]._2_2_ = (short)((ulong)uVar3 >> 0x10);
    D[1]._4_2_ = (short)((ulong)uVar3 >> 0x20);
    D[1]._6_2_ = (short)((ulong)uVar3 >> 0x30);
    C[0]._0_2_ = (short)uVar4;
    C[0]._2_2_ = (short)((ulong)uVar4 >> 0x10);
    C[0]._4_2_ = (short)((ulong)uVar4 >> 0x20);
    C[0]._6_2_ = (short)((ulong)uVar4 >> 0x30);
    A[1]._0_2_ = (short)uVar5;
    A[1]._2_2_ = (short)((ulong)uVar5 >> 0x10);
    A[1]._4_2_ = (short)((ulong)uVar5 >> 0x20);
    A[1]._6_2_ = (short)((ulong)uVar5 >> 0x30);
    sStack_20 = (short)uVar6;
    sStack_1e = (short)((ulong)uVar6 >> 0x10);
    sStack_1c = (short)((ulong)uVar6 >> 0x20);
    sStack_1a = (short)((ulong)uVar6 >> 0x30);
    *(ulong *)(dst + local_90) =
         CONCAT26(A[1]._6_2_ + (C[1]._6_2_ - D[1]._6_2_),
                  CONCAT24(A[1]._4_2_ + (C[1]._4_2_ - D[1]._4_2_),
                           CONCAT22(A[1]._2_2_ + (C[1]._2_2_ - D[1]._2_2_),
                                    (short)A[1] + ((short)C[1] - (short)D[1]))));
    *(ulong *)(dst + local_90 + 4) =
         CONCAT26(sStack_1a + (B[0]._6_2_ - C[0]._6_2_),
                  CONCAT24(sStack_1c + (B[0]._4_2_ - C[0]._4_2_),
                           CONCAT22(sStack_1e + (B[0]._2_2_ - C[0]._2_2_),
                                    sStack_20 + ((short)B[0] - (short)C[0]))));
  }
  for (; local_90 < len; local_90 = local_90 + 1) {
    dst[local_90] = dst[local_90] + (ref[local_90] - src[local_90]);
  }
  return;
}

Assistant:

static void SharpYuvUpdateRGB_SSE2(const int16_t* ref, const int16_t* src,
                                   int16_t* dst, int len) {
  int i = 0;
  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i A = _mm_loadu_si128((const __m128i*)(ref + i));
    const __m128i B = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i C = _mm_loadu_si128((const __m128i*)(dst + i));
    const __m128i D = _mm_sub_epi16(A, B);   // diff_uv
    const __m128i E = _mm_add_epi16(C, D);   // new_uv
    _mm_storeu_si128((__m128i*)(dst + i), E);
  }
  for (; i < len; ++i) {
    const int diff_uv = ref[i] - src[i];
    dst[i] += diff_uv;
  }
}